

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

char * __thiscall Catch::StringRef::c_str(StringRef *this)

{
  bool bVar1;
  ReusableStringStream *this_00;
  ReusableStringStream local_48;
  string local_30;
  StringRef *local_10;
  StringRef *this_local;
  
  local_10 = this;
  bVar1 = isNullTerminated(this);
  if (!bVar1) {
    ReusableStringStream::ReusableStringStream(&local_48);
    this_00 = ReusableStringStream::operator<<
                        (&local_48,
                         (char (*) [60])
                         "Called StringRef::c_str() on a non-null-terminated instance");
    ReusableStringStream::str_abi_cxx11_(&local_30,this_00);
    throw_domain_error(&local_30);
  }
  return this->m_start;
}

Assistant:

auto StringRef::c_str() const -> char const* {
        CATCH_ENFORCE(isNullTerminated(), "Called StringRef::c_str() on a non-null-terminated instance");
        return m_start;
    }